

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportPubKeys
          (LegacyScriptPubKeyMan *this,
          vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>
          *ordered_pubkeys,
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          *pubkey_map,
          map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          *key_origins,bool add_keypool,int64_t timestamp)

{
  long lVar1;
  pointer ppVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  size_t sVar9;
  CPubKey *pubKey;
  pointer __k;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  WalletBatch local_b0;
  string local_a0;
  CPubKey temp;
  WalletDatabase *pWVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar5 = (WalletDatabase *)CONCAT44(extraout_var,iVar4);
  (*pWVar5->_vptr_WalletDatabase[0xe])(&local_b0,pWVar5,1);
  local_b0.m_database = pWVar5;
  for (p_Var6 = (key_origins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(key_origins->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    AddKeyOriginWithDB(this,&local_b0,(CPubKey *)&p_Var6[1]._M_right,(KeyOriginInfo *)(p_Var6 + 4));
  }
  ppVar2 = (ordered_pubkeys->
           super__Vector_base<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (__k = (ordered_pubkeys->
             super__Vector_base<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>)
             ._M_impl.super__Vector_impl_data._M_start; __k != ppVar2; __k = __k + 1) {
    cVar7 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::find(&pubkey_map->_M_t,&__k->first);
    if ((_Rb_tree_header *)cVar7._M_node != &(pubkey_map->_M_t)._M_impl.super__Rb_tree_header) {
      temp.vch[0] = 0xff;
      iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1f])
                        (this,__k,&temp);
      if ((char)iVar4 == '\0') {
        pubKey = (CPubKey *)((long)&cVar7._M_node[1]._M_left + 4);
        GetScriptForRawPubKey((CScript *)&local_a0,pubKey);
        bVar3 = AddWatchOnlyWithDB(this,&local_b0,(CScript *)&local_a0,timestamp);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_a0);
        if (!bVar3) break;
        pmVar8 = std::
                 map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                 ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,&__k->first);
        pmVar8->nCreateTime = timestamp;
        if (add_keypool) {
          AddKeypoolPubkeyWithDB(this,pubKey,__k->second,&local_b0);
          boost::signals2::
          signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
          ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.
                        NotifyCanGetAddressesChanged);
        }
      }
      else {
        sVar9 = 0x21;
        if ((temp.vch[0] & 0xfe) != 2) {
          if ((byte)(temp.vch[0] - 4) < 4) {
            sVar9 = *(size_t *)(&DAT_00b5ace0 + (ulong)(byte)(temp.vch[0] - 4) * 8);
          }
          else {
            sVar9 = 0;
          }
        }
        s.m_size = sVar9;
        s.m_data = temp.vch;
        HexStr_abi_cxx11_(&local_a0,s);
        ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                  ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0xe01f90,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
  }
  if (local_b0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_b0.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __k == ppVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportPubKeys(const std::vector<std::pair<CKeyID, bool>>& ordered_pubkeys, const std::map<CKeyID, CPubKey>& pubkey_map, const std::map<CKeyID, std::pair<CPubKey, KeyOriginInfo>>& key_origins, const bool add_keypool, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : key_origins) {
        AddKeyOriginWithDB(batch, entry.second.first, entry.second.second);
    }
    for (const auto& [id, internal] : ordered_pubkeys) {
        auto entry = pubkey_map.find(id);
        if (entry == pubkey_map.end()) {
            continue;
        }
        const CPubKey& pubkey = entry->second;
        CPubKey temp;
        if (GetPubKey(id, temp)) {
            // Already have pubkey, skipping
            WalletLogPrintf("Already have pubkey %s, skipping\n", HexStr(temp));
            continue;
        }
        if (!AddWatchOnlyWithDB(batch, GetScriptForRawPubKey(pubkey), timestamp)) {
            return false;
        }
        mapKeyMetadata[id].nCreateTime = timestamp;

        // Add to keypool only works with pubkeys
        if (add_keypool) {
            AddKeypoolPubkeyWithDB(pubkey, internal, batch);
            NotifyCanGetAddressesChanged();
        }
    }
    return true;
}